

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtWrenchesAndJointTorquesEstimator.cpp
# Opt level: O3

bool __thiscall
iDynTree::ExtWrenchesAndJointTorquesEstimator::estimateLinkNetWrenchesWithoutGravity
          (ExtWrenchesAndJointTorquesEstimator *this,LinkNetTotalWrenchesWithoutGravity *netWrenches
          )

{
  bool bVar1;
  char *pcVar2;
  
  if (this->m_isModelValid == false) {
    pcVar2 = "Model and sensors information not set.";
  }
  else {
    if (this->m_isKinematicsUpdated != false) {
      iDynTree::LinkWrenches::resize((Model *)netWrenches);
      bVar1 = computeLinkNetWrenchesWithoutGravity
                        (&this->m_model,&this->m_linkVels,&this->m_linkProperAccs,netWrenches);
      return bVar1;
    }
    pcVar2 = "Kinematic information not set.";
  }
  iDynTree::reportError
            ("ExtWrenchesAndJointTorquesEstimator","estimateLinkNetWrenchesWithoutGravity",pcVar2);
  return false;
}

Assistant:

bool ExtWrenchesAndJointTorquesEstimator::estimateLinkNetWrenchesWithoutGravity(LinkNetTotalWrenchesWithoutGravity& netWrenches)
{
   if( !m_isModelValid )
    {
        reportError("ExtWrenchesAndJointTorquesEstimator","estimateLinkNetWrenchesWithoutGravity",
                    "Model and sensors information not set.");
        return false;
    }

    if( !m_isKinematicsUpdated )
    {
        reportError("ExtWrenchesAndJointTorquesEstimator","estimateLinkNetWrenchesWithoutGravity",
                    "Kinematic information not set.");
        return false;
    }

    netWrenches.resize(m_model);

    return computeLinkNetWrenchesWithoutGravity(m_model,m_linkVels,m_linkProperAccs,netWrenches);
}